

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benckmark.cpp
# Opt level: O1

void __thiscall Option::printCurrentOption(Option *this)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  
  puts("Current Option : ");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\thost               = ",0x16);
  __s = this->server_ip_;
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10b190);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\tserver_port        = ",0x16);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\ttimeout_ms         = ",0x16);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tconcurrent_num     = ",0x16);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tis_keep_alive      = ",0x16);
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tthread_num         = ",0x16);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tduration           = ",0x16);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tinterval_time_s    = ",0x16);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  return;
}

Assistant:

void Option::printCurrentOption()
{
    printf("Current Option : \n");
    std::cout << "\thost               = " << server_ip_ << "\n" << "\tserver_port        = " << server_port_ << "\n"
              << "\ttimeout_ms         = " << connect_timeout_ms_ << "\n" << "\tconcurrent_num     = "
              << concurrent_num_ << "\n" << "\tis_keep_alive      = " << is_keep_alive_ << "\n"
              << "\tthread_num         = " << thread_num_ << "\n" << "\tduration           = " << duration_ << "\n"
              << "\tinterval_time_s    = " << interval_time_s_ << "\n";
}